

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_peer_id.cpp
# Opt level: O0

peer_id * libtorrent::aux::generate_peer_id(peer_id *__return_storage_ptr__,session_settings *sett)

{
  string *psVar1;
  long lVar2;
  difference_type dVar3;
  iterator __result;
  index_type offset;
  span<char> dest;
  span<char> local_70;
  span<char> local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_30 [8];
  string print;
  session_settings *sett_local;
  
  print.field_2._8_8_ = sett;
  digest32<160L>::digest32(__return_storage_ptr__);
  psVar1 = session_settings::get_str_abi_cxx11_((session_settings *)print.field_2._8_8_,10);
  ::std::__cxx11::string::string(local_30,(string *)psVar1);
  lVar2 = ::std::__cxx11::string::size();
  dVar3 = digest32<160L>::size();
  if (dVar3 < lVar2) {
    digest32<160L>::size();
    ::std::__cxx11::string::resize((ulong)local_30);
  }
  local_48._M_current = (char *)::std::__cxx11::string::begin();
  local_50._M_current = (char *)::std::__cxx11::string::end();
  __result = digest32<160L>::begin(__return_storage_ptr__);
  ::std::copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_char*>
            (local_48,local_50,__result);
  lVar2 = ::std::__cxx11::string::size();
  dVar3 = digest32<160L>::size();
  if (lVar2 < dVar3) {
    span<char>::span<libtorrent::digest32<160l>,char,void>(&local_70,__return_storage_ptr__);
    offset = ::std::__cxx11::string::length();
    local_60 = span<char>::subspan(&local_70,offset);
    dest.m_len = (char *)local_60.m_len;
    dest.m_ptr = dest.m_len;
    url_random((aux *)local_60.m_ptr,dest);
  }
  ::std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

peer_id generate_peer_id(session_settings const& sett)
{
	peer_id ret;
	std::string print = sett.get_str(settings_pack::peer_fingerprint);
	if (std::ptrdiff_t(print.size()) > ret.size())
		print.resize(std::size_t(ret.size()));

	// the client's fingerprint
	std::copy(print.begin(), print.end(), ret.begin());
	if (std::ptrdiff_t(print.size()) < ret.size())
		url_random(span<char>(ret).subspan(std::ptrdiff_t(print.length())));
	return ret;
}